

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_unstable.cpp
# Opt level: O0

void merge_2way_unstable(uchar **from0,size_t n0,uchar **from1,size_t n1,uchar **result)

{
  int iVar1;
  uchar *puVar2;
  int cmp_1_0;
  int cmp_0_1;
  int cmp01;
  uchar *key1;
  uchar *key0;
  uchar **result_local;
  size_t n1_local;
  uchar **from1_local;
  size_t n0_local;
  uchar **from0_local;
  
  key1 = *from0;
  _cmp_0_1 = *from1;
  key0 = (uchar *)result;
  result_local = (uchar **)n1;
  n1_local = (size_t)from1;
  from1_local = (uchar **)n0;
  n0_local = (size_t)from0;
  do {
    iVar1 = cmp(key1,_cmp_0_1);
    if (iVar1 < 1) {
      if (iVar1 != 0) goto LAB_0027171a;
    }
    else {
      while( true ) {
        do {
          iVar1 = cmp(_cmp_0_1,key1);
          if (-1 < iVar1) {
            __assert_fail("cmp(key1, key0) < 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_unstable.cpp"
                          ,0x5f,
                          "void merge_2way_unstable(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                         );
          }
          puVar2 = key0 + 8;
          *(uchar **)key0 = _cmp_0_1;
          result_local = (uchar **)((long)result_local + -1);
          key0 = puVar2;
          if (result_local == (uchar **)0x0) goto LAB_0027195a;
          n1_local = n1_local + 8;
          _cmp_0_1 = *(uchar **)n1_local;
          iVar1 = cmp(_cmp_0_1,key1);
        } while (iVar1 < 0);
        if (iVar1 < 1) break;
LAB_0027171a:
        do {
          iVar1 = cmp(key1,_cmp_0_1);
          if (-1 < iVar1) {
            __assert_fail("cmp(key0, key1) < 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_unstable.cpp"
                          ,0x52,
                          "void merge_2way_unstable(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                         );
          }
          puVar2 = key0 + 8;
          *(uchar **)key0 = key1;
          from1_local = (uchar **)((long)from1_local + -1);
          key0 = puVar2;
          if (from1_local == (uchar **)0x0) goto LAB_00271914;
          n0_local = n0_local + 8;
          key1 = *(uchar **)n0_local;
          iVar1 = cmp(key1,_cmp_0_1);
        } while (iVar1 < 0);
        if (iVar1 == 0) break;
      }
    }
    iVar1 = cmp(key1,_cmp_0_1);
    if (iVar1 != 0) {
      __assert_fail("cmp(key0, key1) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_unstable.cpp"
                    ,0x6c,
                    "void merge_2way_unstable(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                   );
    }
    puVar2 = key0 + 8;
    *(uchar **)key0 = key1;
    key0 = key0 + 0x10;
    *(uchar **)puVar2 = _cmp_0_1;
    n0_local = n0_local + 8;
    n1_local = n1_local + 8;
    from1_local = (uchar **)((long)from1_local + -1);
    result_local = (uchar **)((long)result_local + -1);
    if (from1_local == (uchar **)0x0) {
LAB_00271914:
      if (result_local == (uchar **)0x0) {
        return;
      }
      memcpy(key0,(void *)n1_local,(long)result_local << 3);
      return;
    }
    if (result_local == (uchar **)0x0) {
LAB_0027195a:
      if (from1_local != (uchar **)0x0) {
        memcpy(key0,(void *)n0_local,(long)from1_local << 3);
      }
      return;
    }
    key1 = *(uchar **)n0_local;
    _cmp_0_1 = *(uchar **)n1_local;
  } while( true );
}

Assistant:

static void
merge_2way_unstable(unsigned char** restrict from0, size_t n0,
                    unsigned char** restrict from1, size_t n1,
                    unsigned char** restrict result)
{
	debug()<<__func__<<"(), n0="<<n0<<", n1="<<n1<<"\n";
	unsigned char* key0 = *from0;
	unsigned char* key1 = *from1;
initial:
	const int cmp01 = cmp(key0, key1);
	if (cmp01 > 0)  goto state_1lt0;
	if (cmp01 == 0) goto state_0eq1;
	// Fall through.
state_0lt1:
{
	debug() << "\tstate_0lt1\n";
	assert(cmp(key0, key1) <  0);
	*result++ = key0;
	if (--n0 == 0) goto finish0;
	++from0;
	key0 = *from0;
	const int cmp_0_1 = cmp(key0, key1);
	if (cmp_0_1 <  0) goto state_0lt1;
	if (cmp_0_1 == 0) goto state_0eq1;
	// Fall through.
}
state_1lt0:
{
	debug() << "\tstate_1lt0\n";
	assert(cmp(key1, key0) <  0);
	*result++ = key1;
	if (--n1 == 0) goto finish1;
	++from1;
	key1 = *from1;
	const int cmp_1_0 = cmp(key1, key0);
	if (cmp_1_0 < 0) goto state_1lt0;
	if (cmp_1_0 > 0) goto state_0lt1;
	// Fall through.
}
state_0eq1:
{
	debug() << "\tstate_0eq1\n";
	assert(cmp(key0, key1) == 0);
	*result++ = key0;
	*result++ = key1;
	++from0;
	++from1;
	--n0;
	--n1;
	if (n0 == 0) goto finish0;
	if (n1 == 0) goto finish1;
	key0 = *from0;
	key1 = *from1;
	goto initial;
}
finish0:
	assert(n0==0);
	if (n1) (void) memcpy(result, from1, n1*sizeof(unsigned char*));
	debug()<< "~" << __func__ << "\n";
	return;
finish1:
	assert(n1==0);
	if (n0) (void) memcpy(result, from0, n0*sizeof(unsigned char*));
	debug()<< "~" << __func__ << "\n";
	return;
}